

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O1

void opengv::generateMulti2D3DCorrespondences
               (translation_t *position,rotation_t *rotation,translations_t *camOffsets,
               rotations_t *camRotations,size_t pointsPerCam,double noise,double outlierFraction,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiPoints,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiBearingVectors,
               vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
               *gt)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  ulong uVar5;
  pointer pMVar6;
  pointer pMVar7;
  long *plVar8;
  iterator iVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  XprTypeNested pMVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  DenseStorage<double,__1,__1,__1,_0> *this;
  long lVar17;
  pointer pMVar18;
  long lVar19;
  undefined8 *puVar20;
  ulong uVar21;
  long lVar22;
  size_t sVar23;
  ulong uVar24;
  rotation_t *__x;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM5 [64];
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  bearingVectors;
  shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> gt_sub;
  rotation_t camRotation_1;
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  points;
  point_t p;
  value_type local_190;
  rotations_t *local_180;
  undefined1 local_178 [16];
  rotation_t local_168;
  undefined1 local_118 [16];
  variable_if_dynamic<long,__1> vStack_108;
  double dStack_100;
  XprTypeNested pMStack_f8;
  variable_if_dynamic<long,__1> vStack_f0;
  double dStack_e8;
  double dStack_e0;
  translation_t *local_d8;
  translation_t *local_c0;
  value_type local_b8;
  undefined1 local_a8 [8];
  double *pdStack_a0;
  double local_98;
  rotation_t *local_90;
  double *local_88;
  undefined8 local_80;
  long local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_50;
  Vector3d local_48;
  
  local_180 = camRotations;
  local_c0 = position;
  local_50 = outlierFraction;
  if ((camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_178._0_8_ = pointsPerCam * 3;
    uVar27 = 0;
    __x = rotation;
    do {
      this = (DenseStorage<double,__1,__1,__1,_0> *)
             Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_new
                       ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)0x18,(size_t)__x);
      this->m_data = (double *)0x0;
      this->m_rows = 0;
      this->m_cols = 0;
      if ((pointsPerCam != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)pointsPerCam),0)
          < 3)) {
        puVar20 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar20 = acos;
        __cxa_throw(puVar20,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(this,local_178._0_8_,3,pointsPerCam);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Eigen::Matrix<double,_1,_1,0,_1,_1>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 1),(Matrix<double,__1,__1,_0,__1,__1> *)this);
      auVar39 = in_ZMM5._0_16_;
      if (pointsPerCam != 0) {
        lVar22 = 0;
        sVar23 = 0;
        do {
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          generateRandomPoint((Vector3d *)local_118,8.0,4.0);
          auVar39 = in_ZMM5._0_16_;
          pdVar4 = *(double **)
                    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0];
          uVar5 = *(Index *)((long)local_168.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[0] + 8);
          uVar24 = uVar5;
          if ((((ulong)(pdVar4 + uVar5 * sVar23) & 7) == 0) &&
             (uVar24 = (ulong)(-((uint)((ulong)(pdVar4 + uVar5 * sVar23) >> 3) & 0x1fffffff) & 7),
             (long)uVar5 <= (long)uVar24)) {
            uVar24 = uVar5;
          }
          uVar25 = uVar5 - uVar24;
          uVar21 = uVar25 + 7;
          if (-1 < (long)uVar25) {
            uVar21 = uVar25;
          }
          if (0 < (long)uVar24) {
            uVar26 = 0;
            do {
              *(undefined8 *)((long)pdVar4 + uVar26 * 8 + uVar5 * lVar22) =
                   *(undefined8 *)(local_118 + uVar26 * 8);
              uVar26 = uVar26 + 1;
            } while (uVar24 != uVar26);
          }
          uVar21 = (uVar21 & 0xfffffffffffffff8) + uVar24;
          if (7 < (long)uVar25) {
            do {
              uVar11 = *(undefined8 *)(local_118 + uVar24 * 8 + 8);
              lVar19 = (&vStack_108)[uVar24].m_value;
              dVar2 = (&dStack_100)[uVar24];
              pMVar12 = (&pMStack_f8)[uVar24];
              lVar17 = (&vStack_f0)[uVar24].m_value;
              lVar13 = (&vStack_f0)[uVar24 + 1].m_value;
              dVar3 = (&dStack_e0)[uVar24];
              puVar20 = (undefined8 *)((long)pdVar4 + uVar24 * 8 + uVar5 * lVar22);
              *puVar20 = *(undefined8 *)(local_118 + uVar24 * 8);
              puVar20[1] = uVar11;
              puVar20[2] = lVar19;
              puVar20[3] = dVar2;
              puVar20[4] = pMVar12;
              puVar20[5] = lVar17;
              puVar20[6] = lVar13;
              puVar20[7] = dVar3;
              uVar24 = uVar24 + 8;
            } while ((long)uVar24 < (long)uVar21);
          }
          if ((long)uVar21 < (long)uVar5) {
            do {
              *(undefined8 *)((long)pdVar4 + uVar21 * 8 + uVar5 * lVar22) =
                   *(undefined8 *)(local_118 + uVar21 * 8);
              uVar21 = uVar21 + 1;
            } while (uVar5 != uVar21);
          }
          sVar23 = sVar23 + 1;
          lVar22 = lVar22 + 8;
        } while (sVar23 != pointsPerCam);
      }
      __x = &local_168;
      in_ZMM5 = ZEXT1664(auVar39);
      std::
      vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::push_back(gt,(value_type *)__x);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1]);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 < (ulong)(((long)(camOffsets->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(camOffsets->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  auVar39 = in_ZMM5._0_16_;
  if ((camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar27 = 0;
    do {
      local_b8.
      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)operator_new(0x18);
      *(undefined8 *)
       local_b8.
       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr = 0;
      *(pointer *)
       ((long)local_b8.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 8) = (pointer)0x0;
      *(pointer *)
       ((long)local_b8.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 0x10) = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>*>
                (&local_b8.
                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 local_b8.
                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      local_190.
      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)operator_new(0x18);
      *(undefined8 *)
       local_190.
       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr = 0;
      *(pointer *)
       ((long)local_190.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 8) = (pointer)0x0;
      *(pointer *)
       ((long)local_190.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 0x10) = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>*>
                (&local_190.
                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 local_190.
                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      auVar39 = in_ZMM5._0_16_;
      pMVar6 = (camOffsets->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pMVar18 = pMVar6 + uVar27;
      local_78 = *(long *)&(pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data;
      dStack_70 = *(double *)
                   ((long)&(pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data + 8);
      dVar2 = *(double *)
               ((long)&pMVar6[uVar27].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data + 0x10);
      pMVar7 = (local_180->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = *(double *)
             ((long)&pMVar7[uVar27].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data + 0x40);
      pMVar7 = pMVar7 + uVar27;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = *(double *)
             ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 8);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = *(double *)
             ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x10);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = *(double *)
             ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x18);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = *(double *)
             ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x20);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = *(double *)
             ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x28);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = *(double *)
             ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x30);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = *(double *)
             ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x38);
      if (pointsPerCam != 0) {
        lVar22 = 0;
        sVar23 = 0;
        do {
          auVar39 = in_ZMM5._0_16_;
          plVar8 = *(long **)(*(long *)gt + uVar27 * 0x10);
          lVar19 = *plVar8;
          lVar17 = plVar8[1] * sVar23;
          pdVar4 = (double *)(lVar19 + lVar17 * 8);
          local_118._0_8_ = *pdVar4;
          local_118._8_8_ = pdVar4[1];
          vStack_108.m_value = *(long *)(lVar19 + 0x10 + lVar17 * 8);
          iVar9._M_current =
               *(Matrix<double,_3,_1,_0,_3,_1> **)
                ((long)local_b8.
                       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 8);
          if (iVar9._M_current ==
              *(Matrix<double,_3,_1,_0,_3,_1> **)
               ((long)local_b8.
                      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x10)) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)local_b8.
                          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,iVar9,(Matrix<double,_3,_1,_0,_3,_1> *)local_118);
          }
          else {
            ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] = (double)vStack_108.m_value;
            ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] = (double)local_118._0_8_;
            ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] = (double)local_118._8_8_;
            *(long *)((long)local_b8.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 8) =
                 *(long *)((long)local_b8.
                                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 8) + 0x18;
          }
          pMStack_f8 = *(XprTypeNested *)(*(long *)gt + uVar27 * 0x10);
          vStack_108.m_value =
               (pMStack_f8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows;
          local_118._8_8_ =
               (pMStack_f8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data + vStack_108.m_value * sVar23;
          vStack_f0.m_value = 0;
          local_d8 = local_c0;
          in_ZMM5 = ZEXT1664(auVar39);
          local_118._0_8_ = rotation;
          dStack_e8 = (double)sVar23;
          dStack_e0 = (double)vStack_108.m_value;
          local_a8 = (undefined1  [8])rotation;
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                    ((Matrix<double,_1,1,0,_1,1> *)&pdStack_a0,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                      *)(local_118 + 8));
          local_90 = (rotation_t *)local_a8;
          local_88 = pdStack_a0;
          local_80 = 3;
          dVar28 = *pdStack_a0;
          dVar30 = pdStack_a0[1];
          dVar3 = pdStack_a0[2];
          auVar35._8_8_ = 0;
          auVar35._0_8_ =
               (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_a8)->m_storage).
               m_data.array[2];
          auVar39 = vmovhpd_avx(auVar35,(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                         local_a8)->m_storage).m_data.array[5]);
          auVar31._0_8_ =
               dVar28 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_a8)->
                        m_storage).m_data.array[0] +
               dVar30 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_a8)->
                        m_storage).m_data.array[1] + dVar3 * auVar39._0_8_;
          auVar31._8_8_ =
               dVar28 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_a8)->
                        m_storage).m_data.array[3] +
               dVar30 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_a8)->
                        m_storage).m_data.array[4] + dVar3 * auVar39._8_8_;
          auVar10._8_8_ = dStack_70;
          auVar10._0_8_ = local_78;
          local_178 = vsubpd_avx(auVar31,auVar10);
          local_68 = dVar3 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_a8)->
                             m_storage).m_data.array[8] +
                     dVar28 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_a8)
                              ->m_storage).m_data.array[6] +
                     dVar30 * (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_a8)
                              ->m_storage).m_data.array[7];
          free((void *)pdStack_a0[-1]);
          dVar3 = local_68 - dVar2;
          dVar28 = local_178._0_8_;
          dVar30 = local_178._8_8_;
          auVar39._8_8_ =
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar39._0_8_ =
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2];
          auVar39 = vmovhpd_avx(auVar39,local_168.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array[5]);
          local_a8 = (undefined1  [8])
                     (dVar3 * auVar39._0_8_ +
                     dVar28 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[0] +
                     dVar30 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[1]);
          pdStack_a0 = (double *)
                       (dVar3 * auVar39._8_8_ +
                       dVar28 * local_168.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3] +
                       dVar30 * local_168.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
          local_98 = dVar3 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[8] +
                     dVar28 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[6] +
                     dVar30 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[7];
          iVar9._M_current =
               *(Matrix<double,_3,_1,_0,_3,_1> **)
                ((long)local_190.
                       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 8);
          if (iVar9._M_current ==
              *(Matrix<double,_3,_1,_0,_3,_1> **)
               ((long)local_190.
                      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x10)) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)local_190.
                          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,iVar9,(Matrix<double,_3,_1,_0,_3,_1> *)local_a8);
          }
          else {
            ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] = local_98;
            ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] = (double)local_a8;
            ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] = (double)pdStack_a0;
            *(long *)((long)local_190.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 8) =
                 *(long *)((long)local_190.
                                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 8) + 0x18;
          }
          lVar19 = *(long *)local_190.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
          auVar39 = *(undefined1 (*) [16])(lVar19 + lVar22);
          dVar3 = *(double *)(lVar19 + 0x10 + lVar22);
          auVar32._8_8_ = 0;
          auVar32._0_8_ =
               dVar3 * dVar3 + auVar39._0_8_ * auVar39._0_8_ + auVar39._8_8_ * auVar39._8_8_;
          auVar10 = vsqrtpd_avx(auVar32);
          dVar28 = auVar10._0_8_;
          auVar36._8_8_ = dVar28;
          auVar36._0_8_ = dVar28;
          auVar39 = vdivpd_avx(auVar39,auVar36);
          *(undefined1 (*) [16])(lVar19 + lVar22) = auVar39;
          *(double *)(lVar19 + 0x10 + lVar22) = dVar3 / dVar28;
          if (0.0 < noise) {
            pdVar4 = (double *)
                     (*(long *)local_190.
                               super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar22);
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = *pdVar4;
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = pdVar4[1];
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = *(double *)
                        (*(long *)local_190.
                                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x10 + lVar22);
            addNoise((Vector3d *)local_118,noise,&local_48);
            lVar19 = *(long *)local_190.
                              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
            *(long *)(lVar19 + 0x10 + lVar22) = vStack_108.m_value;
            puVar20 = (undefined8 *)(lVar19 + lVar22);
            *puVar20 = local_118._0_8_;
            puVar20[1] = local_118._8_8_;
          }
          auVar39 = in_ZMM5._0_16_;
          sVar23 = sVar23 + 1;
          lVar22 = lVar22 + 0x18;
        } while (pointsPerCam != sVar23);
      }
      in_ZMM5 = ZEXT1664(auVar39);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::push_back(multiPoints,&local_b8);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::push_back(multiBearingVectors,&local_190);
      if (local_190.
          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_190.
                   super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_b8.
          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.
                   super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      auVar39 = in_ZMM5._0_16_;
      uVar27 = uVar27 + 1;
    } while (uVar27 < (ulong)(((long)(camOffsets->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(camOffsets->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  pMVar18 = (camOffsets->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar18) {
    auVar39 = vcvtusi2sd_avx512f(auVar39,pointsPerCam);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = auVar39._0_8_ * local_50;
    auVar39 = vroundsd_avx(auVar29,auVar29,9);
    lVar22 = vcvttsd2usi_avx512f(auVar39);
    pdVar4 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array + 1;
    uVar27 = 0;
    do {
      local_68 = pMVar18[uVar27].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
      dStack_60 = pMVar18[uVar27].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
      dVar2 = pMVar18[uVar27].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array[2];
      pMVar7 = (local_180->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_d8 = *(translation_t **)
                  ((long)&pMVar7[uVar27].
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data + 0x40);
      pMVar7 = pMVar7 + uVar27;
      local_118._0_8_ =
           (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
      local_118._8_8_ =
           *(double *)
            ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                    .m_data + 8);
      vStack_108.m_value =
           *(long *)((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x10);
      dStack_100 = *(double *)
                    ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x18);
      pMStack_f8 = *(XprTypeNested *)
                    ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x20);
      vStack_f0.m_value =
           *(long *)((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x28);
      dStack_e8 = *(double *)
                   ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data + 0x30);
      dStack_e0 = *(double *)
                   ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data + 0x38);
      if (lVar22 != 0) {
        lVar17 = 0x10;
        local_78 = uVar27 << 4;
        lVar19 = lVar22;
        do {
          local_178._0_8_ = lVar19;
          generateRandomPoint((Vector3d *)local_a8,8.0,4.0);
          auVar16._8_8_ = dStack_60;
          auVar16._0_8_ = local_68;
          auVar15._8_8_ = pdStack_a0;
          auVar15._0_8_ = local_a8;
          auVar39 = vsubpd_avx(auVar15,*(undefined1 (*) [16])
                                        (local_c0->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        ).m_storage.m_data.array);
          dVar3 = local_98 -
                  (local_c0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                  .m_data.array[2];
          dVar28 = auVar39._0_8_;
          dVar30 = auVar39._8_8_;
          auVar38._8_8_ = 0;
          auVar38._0_8_ =
               (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[2];
          auVar39 = vmovhpd_avx(auVar38,(rotation->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[5]);
          auVar34._0_8_ =
               dVar3 * auVar39._0_8_ +
               dVar28 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[0] +
               dVar30 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[1];
          auVar34._8_8_ =
               dVar3 * auVar39._8_8_ +
               dVar28 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[3] +
               dVar30 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[4];
          auVar39 = vsubpd_avx(auVar34,auVar16);
          lVar19 = **(long **)(*(long *)multiBearingVectors + local_78);
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = auVar39._0_8_;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] = auVar39._8_8_;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] = (dVar3 * (rotation->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[8] +
                     dVar28 * (rotation->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6] +
                     dVar30 * (rotation->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7]) - dVar2;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] = 1.48219693752374e-323;
          auVar14._8_8_ = dStack_100;
          auVar14._0_8_ = vStack_108.m_value;
          auVar39 = vmovhpd_avx(auVar14,vStack_f0.m_value);
          pdVar1 = (double *)(lVar19 + -0x10 + lVar17);
          *pdVar1 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[3] * auVar39._0_8_ +
                    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1] * (double)local_118._0_8_ +
                    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[2] * (double)local_118._8_8_;
          pdVar1[1] = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3] * auVar39._8_8_ +
                      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1] * dStack_100 +
                      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2] * (double)pMStack_f8;
          *(double *)(lVar19 + lVar17) =
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] * (double)local_d8 +
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] * dStack_e8 +
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] * dStack_e0;
          lVar19 = **(long **)(*(long *)multiBearingVectors + local_78);
          auVar39 = *(undefined1 (*) [16])(lVar19 + -0x10 + lVar17);
          dVar3 = *(double *)(lVar19 + lVar17);
          auVar33._8_8_ = 0;
          auVar33._0_8_ =
               dVar3 * dVar3 + auVar39._0_8_ * auVar39._0_8_ + auVar39._8_8_ * auVar39._8_8_;
          auVar10 = vsqrtpd_avx(auVar33);
          dVar28 = auVar10._0_8_;
          auVar37._8_8_ = dVar28;
          auVar37._0_8_ = dVar28;
          auVar39 = vdivpd_avx(auVar39,auVar37);
          *(undefined1 (*) [16])(lVar19 + -0x10 + lVar17) = auVar39;
          *(double *)(lVar19 + lVar17) = dVar3 / dVar28;
          lVar17 = lVar17 + 0x18;
          lVar19 = local_178._0_8_ + -1;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = (double)local_118;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4] = (double)local_118;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] = (double)pdVar4;
        } while (lVar19 != 0);
      }
      uVar27 = uVar27 + 1;
      pMVar18 = (camOffsets->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar27 < (ulong)(((long)(camOffsets->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar18 >>
                              3) * -0x5555555555555555));
  }
  return;
}

Assistant:

void
opengv::generateMulti2D3DCorrespondences(
    const translation_t & position,
    const rotation_t & rotation,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t pointsPerCam,
    double noise,
    double outlierFraction,
    std::vector<std::shared_ptr<points_t> > & multiPoints,
    std::vector<std::shared_ptr<bearingVectors_t> > & multiBearingVectors,
    std::vector<std::shared_ptr<Eigen::MatrixXd> > & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    std::shared_ptr<Eigen::MatrixXd> gt_sub(new Eigen::MatrixXd(3,pointsPerCam));
    for( size_t i = 0; i < pointsPerCam; i++ )
      gt_sub->col(i) = generateRandomPoint( maxDepth, minDepth );
    gt.push_back(gt_sub);
  }

  //iterate through the cameras (pairs)
  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    //create the bearing-vector arrays for this camera
    std::shared_ptr<points_t> points(new points_t());
    std::shared_ptr<bearingVectors_t> bearingVectors(new bearingVectors_t());

    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //now iterate through the points of that camera
    for( size_t i = 0; i < (size_t) pointsPerCam; i++ )
    {
      points->push_back(gt[cam]->col(i));

      //project the point into the viewpoint frame
      point_t bodyPoint = rotation.transpose()*(gt[cam]->col(i) - position);

      //project that point into the camera
      bearingVectors->push_back( camRotation.transpose()*(bodyPoint - camOffset) );

      //normalize the vector
      (*bearingVectors)[i] = (*bearingVectors)[i] / (*bearingVectors)[i].norm();

      //add noise
      if( noise > 0.0 )
        (*bearingVectors)[i] = addNoise(noise,(*bearingVectors)[i]);
    }

    //push back the stuff for this camera
    multiPoints.push_back(points);
    multiBearingVectors.push_back(bearingVectors);
  }

  //add outliers
  size_t outliersPerCam = (size_t) floor(outlierFraction*pointsPerCam);

  //iterate through the cameras
  for(size_t cam = 0; cam < camOffsets.size(); cam++)
  {
    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //add outliers
    for(size_t i = 0; i < outliersPerCam; i++)
    {
      //generate a random point
      point_t p = generateRandomPoint(8,4);

      //transform that point into viewpoint 2 only
      point_t bodyPoint = rotation.transpose()*(p - position);

      //use as measurement (outlier)
      (*(multiBearingVectors[cam].get()))[i] =
          camRotation.transpose()*(bodyPoint - camOffset);

      //normalize
      (*(multiBearingVectors[cam].get()))[i] =
          (*(multiBearingVectors[cam].get()))[i] / (*(multiBearingVectors[cam].get()))[i].norm();
    }
  }
}